

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

EnergyReport * __thiscall
ot::commissioner::CommissionerApp::GetEnergyReport(CommissionerApp *this,Address *aDstAddr)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator report;
  Address *aDstAddr_local;
  CommissionerApp *this_local;
  
  report._M_node = (_Base_ptr)aDstAddr;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
       ::find(&this->mEnergyReports,aDstAddr);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
       ::end(&this->mEnergyReports);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (CommissionerApp *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>
             ::operator->(&local_28);
    this_local = (CommissionerApp *)&ppVar2->second;
  }
  return (EnergyReport *)this_local;
}

Assistant:

const EnergyReport *CommissionerApp::GetEnergyReport(const Address &aDstAddr) const
{
    auto report = mEnergyReports.find(aDstAddr);
    if (report == mEnergyReports.end())
    {
        return nullptr;
    }
    return &report->second;
}